

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

int archive_write_set_format_shar(archive *_a)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_shar");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if ((code *)_a[2].archive_format_name != (code *)0x0) {
      (*(code *)_a[2].archive_format_name)(_a);
    }
    pvVar2 = calloc(1,0x90);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate shar data");
    }
    else {
      *(undefined8 *)((long)pvVar2 + 0x80) = 0;
      *(undefined8 *)((long)pvVar2 + 0x88) = 0;
      *(undefined8 *)((long)pvVar2 + 0x70) = 0;
      *(undefined8 *)((long)pvVar2 + 0x78) = 0;
      *(undefined8 *)((long)pvVar2 + 0x60) = 0;
      *(undefined8 *)((long)pvVar2 + 0x68) = 0;
      _a[1].read_data_offset = (int64_t)pvVar2;
      _a[1].read_data_output_offset = (int64_t)"shar";
      *(code **)(_a + 2) = archive_write_shar_header;
      *(code **)&_a[2].archive_format = archive_write_shar_close;
      _a[2].archive_format_name = (char *)archive_write_shar_free;
      _a[2].vtable = (archive_vtable_conflict *)archive_write_shar_data_sed;
      _a[1].read_data_requested = (size_t)archive_write_shar_finish_entry;
      _a->archive_format = 0x20001;
      _a->archive_format_name = "shar";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_shar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct shar *shar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_shar");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	shar = (struct shar *)calloc(1, sizeof(*shar));
	if (shar == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate shar data");
		return (ARCHIVE_FATAL);
	}
	archive_string_init(&shar->work);
	archive_string_init(&shar->quoted_name);
	a->format_data = shar;
	a->format_name = "shar";
	a->format_write_header = archive_write_shar_header;
	a->format_close = archive_write_shar_close;
	a->format_free = archive_write_shar_free;
	a->format_write_data = archive_write_shar_data_sed;
	a->format_finish_entry = archive_write_shar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_SHAR_BASE;
	a->archive.archive_format_name = "shar";
	return (ARCHIVE_OK);
}